

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t coda_strnspn(char *s,char *n,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  char *p;
  char *pcVar3;
  char cVar4;
  
  pcVar2 = s;
  if (0 < (long)len) {
    pcVar1 = s;
    while (pcVar2 = s, *n != '\0') {
      pcVar3 = n + 1;
      cVar4 = *n;
      while (*pcVar1 != cVar4) {
        cVar4 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        pcVar2 = pcVar1;
        if (cVar4 == '\0') goto LAB_00105423;
      }
      pcVar1 = pcVar1 + 1;
      pcVar2 = pcVar1;
      if (s + len <= pcVar1) break;
    }
  }
LAB_00105423:
  return (long)pcVar2 - (long)s;
}

Assistant:

size_t coda_strnspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}

		if (!*x) break;
	}

	return p - s;
}